

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O3

void mergesort_4way_unstable(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  uchar **ppuVar4;
  ulong uVar5;
  uchar **ppuVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  ulong n_00;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  
  if (0x1f < n) {
    n_00 = n >> 2;
    auVar11._8_4_ = (int)(n >> 0x20);
    auVar11._0_8_ = n;
    auVar11._12_4_ = 0x45300000;
    uVar10 = n >> 1;
    dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.75;
    uVar5 = (ulong)dVar12;
    uVar5 = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    mergesort_4way_unstable(strings,n_00,tmp);
    mergesort_4way_unstable(strings + n_00,uVar10 - n_00,tmp);
    mergesort_4way_unstable(strings + uVar10,uVar5 - uVar10,tmp);
    mergesort_4way_unstable(strings + uVar5,n - uVar5,tmp);
    merge_4way_unstable(strings,n_00,strings + n_00,uVar10 - n_00,strings + uVar10,uVar5 - uVar10,
                        strings + uVar5,n - uVar5,tmp);
    memcpy(strings,tmp,n << 3);
    return;
  }
  ppuVar4 = strings;
  if (1 < n) {
    do {
      pbVar1 = ppuVar4[1];
      for (ppuVar6 = ppuVar4 + 1; strings < ppuVar6; ppuVar6 = ppuVar6 + -1) {
        pbVar2 = ppuVar6[-1];
        bVar7 = *pbVar2;
        bVar8 = *pbVar1;
        if (bVar7 != 0 && bVar7 == bVar8) {
          lVar9 = 1;
          do {
            bVar7 = pbVar2[lVar9];
            bVar8 = pbVar1[lVar9];
            if (bVar7 == 0) break;
            lVar9 = lVar9 + 1;
          } while (bVar7 == bVar8);
        }
        if (bVar7 <= bVar8) break;
        *ppuVar6 = pbVar2;
      }
      iVar3 = (int)n;
      *ppuVar6 = pbVar1;
      n = (size_t)(iVar3 - 1);
      ppuVar4 = ppuVar4 + 1;
    } while (2 < iVar3);
  }
  return;
}

Assistant:

void
mergesort_4way_unstable(unsigned char** strings, size_t n, unsigned char** tmp)
{
	//debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = size_t(0.75*n);
	mergesort_4way_unstable(strings,        split0,        tmp);
	mergesort_4way_unstable(strings+split0, split1-split0, tmp);
	mergesort_4way_unstable(strings+split1, split2-split1, tmp);
	mergesort_4way_unstable(strings+split2, n-split2,      tmp);
	merge_4way_unstable(strings,        split0,
	                    strings+split0, split1-split0,
	                    strings+split1, split2-split1,
	                    strings+split2, n-split2,
	                    tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}